

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O3

MPP_RET dec_task_info_init(HalTaskInfo *task)

{
  (task->dec).valid = 0;
  (task->dec).flags.val = 0;
  (task->dec).input_packet = (MppPacket)0x0;
  (task->dec).output = -1;
  (task->dec).input = -1;
  ((MppSyntax *)((long)task + 0x10))->number = 0;
  *(undefined4 *)&((MppSyntax *)((long)task + 0x10))->field_0x4 = 0;
  ((MppSyntax *)((long)task + 0x10))->data = (void *)0x0;
  (task->dec).refer[0] = -1;
  (task->dec).refer[1] = -1;
  (task->dec).refer[2] = -1;
  (task->dec).refer[3] = -1;
  (task->dec).refer[4] = -1;
  (task->dec).refer[5] = -1;
  (task->dec).refer[6] = -1;
  (task->dec).refer[7] = -1;
  (task->dec).refer[8] = -1;
  (task->dec).refer[9] = -1;
  (task->dec).refer[10] = -1;
  (task->dec).refer[0xb] = -1;
  (task->dec).refer[0xc] = -1;
  (task->dec).refer[0xd] = -1;
  (task->dec).refer[0xe] = -1;
  (task->dec).refer[0xf] = -1;
  (task->dec).refer[0x10] = -1;
  return MPP_OK;
}

Assistant:

MPP_RET dec_task_info_init(HalTaskInfo *task)
{
    HalDecTask *p = &task->dec;

    p->valid  = 0;
    p->flags.val = 0;
    p->flags.eos = 0;
    p->input_packet = NULL;
    p->output = -1;
    p->input = -1;
    memset(&task->dec.syntax, 0, sizeof(task->dec.syntax));
    memset(task->dec.refer, -1, sizeof(task->dec.refer));

    return MPP_OK;
}